

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.cpp
# Opt level: O0

int __thiscall pstore::region::mem_based_factory::init(mem_based_factory *this,EVP_PKEY_CTX *ctx)

{
  shared_ptr<pstore::file::in_memory> local_28;
  EVP_PKEY_CTX *local_18;
  mem_based_factory *this_local;
  
  local_18 = ctx;
  this_local = this;
  std::shared_ptr<pstore::file::in_memory>::shared_ptr
            (&local_28,(shared_ptr<pstore::file::in_memory> *)(ctx + 0x18));
  factory::create<pstore::file::in_memory,pstore::in_memory_mapper>
            ((vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
              *)this,(factory *)ctx,&local_28);
  std::shared_ptr<pstore::file::in_memory>::~shared_ptr(&local_28);
  return (int)this;
}

Assistant:

auto mem_based_factory::init () -> std::vector<memory_mapper_ptr> {
            return this->create<file::in_memory, in_memory_mapper> (file_);
        }